

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

bool uWS::WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
     consumeMessage<14u,unsigned_long>
               (unsigned_long payLength,char **src,uint *length,WebSocketState<true> *wState,
               void *user)

{
  ulong uVar1;
  OpCode OVar2;
  bool bVar3;
  OpCode OVar4;
  byte bVar5;
  OpCode OVar6;
  char *pcVar7;
  
  OVar6 = **src;
  OVar2 = *(OpCode *)&wState->state;
  OVar4 = OVar6 & 0xf;
  if (OVar4 == 0) {
    if ((OVar2 & 0x60) == 0x60) goto LAB_0016b02d;
  }
  else {
    if (((OVar2 & 0x60) == 0x20) || (OVar4 == TEXT && -1 < (char)OVar2)) goto LAB_0016b02d;
    bVar5 = (OVar2 >> 5) + 1;
    OVar2 = OVar2 & 0x9f | (bVar5 & 3) << 5;
    *(OpCode *)&wState->state = OVar2;
    (wState->state).opCode[(long)((ulong)bVar5 << 0x3e) >> 0x3e] = OVar4;
    OVar6 = **src;
  }
  *(OpCode *)&wState->state = OVar2 & 0x7f | OVar6 & 0x80;
  bVar3 = WebSocketContext<false,_true>::refusePayloadLength(payLength,wState,user);
  if (!bVar3) {
    uVar1 = payLength + 0xe;
    if (*length < uVar1) {
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe0;
      wState->remainingBytes = ((uint)payLength - *length) + 0xe;
      bVar5 = **src;
      *(undefined4 *)wState->mask = *(undefined4 *)(*src + 10);
      WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::unmaskImprecise
                (*src,*src + 0xe,wState->mask,*length - 0xe);
      WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::rotateMask
                ((*length & 3 ^ 0xfffffffd) + 5,wState->mask);
      WebSocketContext<false,_true>::handleFragment
                (*src,(ulong)(*length - 0xe),wState->remainingBytes,
                 (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                 (bool)(bVar5 >> 7),wState,user);
      return true;
    }
    pcVar7 = *src + 10;
    WebSocketProtocol<true,_uWS::WebSocketContext<false,_true>_>::unmaskImpreciseCopyMask
              (pcVar7,*src + 0xe,pcVar7,(uint)payLength);
    bVar3 = WebSocketContext<false,_true>::handleFragment
                      (*src + 10,payLength,0,
                       (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                       (bool)((byte)**src >> 7),wState,user);
    if (!bVar3) {
      pcVar7 = *src;
      if (*pcVar7 < '\0') {
        *(byte *)&wState->state =
             *(byte *)&wState->state & 0x9f | *(byte *)&wState->state + 0x60 & 0x60;
        pcVar7 = *src;
      }
      *src = pcVar7 + uVar1;
      *length = *length - (int)uVar1;
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe1;
      return false;
    }
    return true;
  }
LAB_0016b02d:
  us_socket_close(0,user);
  return true;
}

Assistant:

static inline bool consumeMessage(T payLength, char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (getOpCode(src)) {
            if (wState->state.opStack == 1 || (!wState->state.lastFin && getOpCode(src) < 2)) {
                Impl::forceClose(wState, user);
                return true;
            }
            wState->state.opCode[++wState->state.opStack] = (OpCode) getOpCode(src);
        } else if (wState->state.opStack == -1) {
            Impl::forceClose(wState, user);
            return true;
        }
        wState->state.lastFin = isFin(src);

        if (Impl::refusePayloadLength(payLength, wState, user)) {
            Impl::forceClose(wState, user);
            return true;
        }

        if (payLength + MESSAGE_HEADER <= length) {
            if (isServer) {
                unmaskImpreciseCopyMask(src + MESSAGE_HEADER - 4, src + MESSAGE_HEADER, src + MESSAGE_HEADER - 4, (unsigned int) payLength);
                if (Impl::handleFragment(src + MESSAGE_HEADER - 4, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            } else {
                if (Impl::handleFragment(src + MESSAGE_HEADER, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            }

            if (isFin(src)) {
                wState->state.opStack--;
            }

            src += payLength + MESSAGE_HEADER;
            length -= (unsigned int) (payLength + MESSAGE_HEADER);
            wState->state.spillLength = 0;
            return false;
        } else {
            wState->state.spillLength = 0;
            wState->state.wantsHead = false;
            wState->remainingBytes = (unsigned int) (payLength - length + MESSAGE_HEADER);
            bool fin = isFin(src);
            if (isServer) {
                memcpy(wState->mask, src + MESSAGE_HEADER - 4, 4);
                unmaskImprecise(src, src + MESSAGE_HEADER, wState->mask, length - MESSAGE_HEADER);
                rotateMask(4 - (length - MESSAGE_HEADER) % 4, wState->mask);
            } else {
                src += MESSAGE_HEADER;
            }
            Impl::handleFragment(src, length - MESSAGE_HEADER, wState->remainingBytes, wState->state.opCode[wState->state.opStack], fin, wState, user);
            return true;
        }
    }